

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecStr.h
# Opt level: O3

void Vec_StrPrintStr(Vec_Str_t *p,char *pStr)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  size_t __size;
  size_t sVar4;
  char *pcVar5;
  ulong uVar6;
  
  sVar4 = strlen(pStr);
  if (0 < (int)(uint)sVar4) {
    uVar6 = 0;
    do {
      cVar1 = pStr[uVar6];
      uVar2 = p->nSize;
      if (uVar2 == p->nCap) {
        if ((int)uVar2 < 0x10) {
          if (p->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(0x10);
          }
          else {
            pcVar5 = (char *)realloc(p->pArray,0x10);
          }
          p->pArray = pcVar5;
          p->nCap = 0x10;
        }
        else {
          __size = (ulong)uVar2 * 2;
          if (p->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(__size);
          }
          else {
            pcVar5 = (char *)realloc(p->pArray,__size);
          }
          p->pArray = pcVar5;
          p->nCap = (int)__size;
        }
      }
      else {
        pcVar5 = p->pArray;
      }
      iVar3 = p->nSize;
      p->nSize = iVar3 + 1;
      pcVar5[iVar3] = cVar1;
      uVar6 = uVar6 + 1;
    } while (((uint)sVar4 & 0x7fffffff) != uVar6);
  }
  return;
}

Assistant:

static inline void Vec_StrPrintStr( Vec_Str_t * p, const char * pStr )
{
    int i, Length = (int)strlen(pStr);
    for ( i = 0; i < Length; i++ )
        Vec_StrPush( p, pStr[i] );
}